

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf-split.cpp
# Opt level: O3

bool __thiscall split_strategy::should_split(split_strategy *this,int i_tensor,size_t next_size)

{
  split_mode sVar1;
  void *__src;
  long lVar2;
  undefined1 *__dest;
  size_type __n;
  gguf_context **__dest_00;
  undefined8 *extraout_RDX;
  undefined1 *__src_00;
  char *pcVar3;
  size_t sVar4;
  void *__dest_01;
  ulong __n_00;
  bool bVar5;
  undefined1 auVar6 [16];
  ulong uStack_30;
  
  sVar1 = (this->params).mode;
  if (sVar1 == MODE_TENSOR) {
    bVar5 = false;
    if ((0 < i_tensor) && (i_tensor < this->n_tensors)) {
      return i_tensor % (this->params).n_split_tensors == 0;
    }
  }
  else {
    if (sVar1 != MODE_SIZE) {
      pcVar3 = anon_var_dwarf_2d3;
      __src_00 = &DAT_0000011f;
      auVar6 = ggml_abort(anon_var_dwarf_2d3,0x11f,"invalid mode");
      uStack_30 = auVar6._0_8_;
      if (auVar6._8_8_ == 0 || __src_00 != (undefined1 *)0x0) {
        __n_00 = auVar6._8_8_ - (long)__src_00;
        uStack_30 = __n_00;
        if (__n_00 < 0x10) {
          __dest = *(undefined1 **)pcVar3;
        }
        else {
          __dest = (undefined1 *)std::__cxx11::string::_M_create((ulong *)pcVar3,(ulong)&uStack_30);
          *(undefined1 **)pcVar3 = __dest;
          *(ulong *)((long)pcVar3 + 0x10) = uStack_30;
        }
        if (__n_00 != 0) {
          if (__n_00 == 1) {
            *__dest = *__src_00;
          }
          else {
            memcpy(__dest,__src_00,__n_00);
          }
        }
        *(ulong *)((long)pcVar3 + 8) = uStack_30;
        *(undefined1 *)(*(ulong *)pcVar3 + uStack_30) = 0;
        return SUB81(uStack_30,0);
      }
      pcVar3 = anon_var_dwarf_1b5;
      std::__throw_logic_error(anon_var_dwarf_1b5);
      __n = std::vector<gguf_context_*,_std::allocator<gguf_context_*>_>::_M_check_len
                      ((vector<gguf_context_*,_std::allocator<gguf_context_*>_> *)pcVar3,1,
                       "vector::_M_realloc_insert");
      __src = *(void **)pcVar3;
      lVar2 = *(long *)((new_allocator<gguf_context_*> *)pcVar3 + 8);
      sVar4 = (long)__src_00 - (long)__src;
      if (__n == 0) {
        __dest_00 = (gguf_context **)0x0;
      }
      else {
        __dest_00 = __gnu_cxx::new_allocator<gguf_context_*>::allocate
                              ((new_allocator<gguf_context_*> *)pcVar3,__n,(void *)0x0);
      }
      __dest_00[(long)sVar4 >> 3] = (gguf_context *)*extraout_RDX;
      if (0 < (long)sVar4) {
        memmove(__dest_00,__src,sVar4);
      }
      __dest_01 = (void *)((long)__dest_00 + sVar4 + 8);
      sVar4 = lVar2 - (long)__src_00;
      if (0 < (long)sVar4) {
        memmove(__dest_01,__src_00,sVar4);
      }
      if (__src != (void *)0x0) {
        operator_delete(__src,*(long *)((new_allocator<gguf_context_*> *)pcVar3 + 0x10) -
                              (long)__src);
      }
      *(gguf_context ***)pcVar3 = __dest_00;
      *(size_t *)((new_allocator<gguf_context_*> *)pcVar3 + 8) = (long)__dest_01 + sVar4;
      *(gguf_context ***)((new_allocator<gguf_context_*> *)pcVar3 + 0x10) = __dest_00 + __n;
      return SUB81(__dest_00 + __n,0);
    }
    bVar5 = (this->params).n_bytes_split < next_size;
  }
  return bVar5;
}

Assistant:

bool should_split(int i_tensor, size_t next_size) {
        if (params.mode == MODE_SIZE) {
            // split by max size per file
            return next_size > params.n_bytes_split;
        } else if (params.mode == MODE_TENSOR) {
            // split by number of tensors per file
            return i_tensor > 0 && i_tensor < n_tensors && i_tensor % params.n_split_tensors == 0;
        }
        // should never happen
        GGML_ABORT("invalid mode");
    }